

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O3

void Kit_TruthChangePhase_64bit(word *pInOut,int nVars,int iVar)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  size_t __n;
  word Temp [512];
  undefined1 local_1038 [4104];
  
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckySwap.c"
                  ,0x6a,"void Kit_TruthChangePhase_64bit(word *, int, int)");
  }
  if (iVar < 6) {
    if (0 < (int)uVar2) {
      uVar1 = mask0[iVar];
      uVar5 = 0;
      do {
        bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
        pInOut[uVar5] =
             (pInOut[uVar5] & ~uVar1) >> (bVar3 & 0x3f) | (uVar1 & pInOut[uVar5]) << (bVar3 & 0x3f);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  else {
    bVar3 = (byte)iVar - 6;
    if (0 < (int)uVar2) {
      __n = (size_t)(8 << (bVar3 & 0x1f));
      lVar4 = 0;
      do {
        memcpy(local_1038,pInOut + lVar4,__n);
        memcpy(pInOut + lVar4,pInOut + (1 << (bVar3 & 0x1f)) + lVar4,__n);
        memcpy(pInOut + (1 << (bVar3 & 0x1f)) + lVar4,local_1038,__n);
        lVar4 = lVar4 + (2 << (bVar3 & 0x1f));
      } while ((int)lVar4 < (int)uVar2);
    }
  }
  return;
}

Assistant:

void Kit_TruthChangePhase_64bit( word * pInOut, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, Step,SizeOfBlock;
    word Temp[512];
    
    assert( iVar < nVars );
    if(iVar<=5)
    {
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = ((pInOut[i] & mask0[iVar]) << (1<<(iVar))) | ((pInOut[i] & ~mask0[iVar]) >> (1<<(iVar)));
    }
    else
    {
        Step = (1 << (iVar - 6));
        SizeOfBlock = sizeof(word)*Step;
        for ( i = 0; i < nWords; i += 2*Step )
        {   
            memcpy(Temp,pInOut,SizeOfBlock);
            memcpy(pInOut,pInOut+Step,SizeOfBlock);
            memcpy(pInOut+Step,Temp,SizeOfBlock);
            //          Temp = pInOut[i];
            //          pInOut[i] = pInOut[Step+i];
            //          pInOut[Step+i] = Temp;          
            pInOut += 2*Step;
        }
    }
    
}